

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  undefined1 auVar1 [16];
  char *__s;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  byte *pbVar6;
  size_t __n;
  byte *__s1;
  unsigned_long *puVar7;
  undefined1 auVar8 [16];
  undefined1 local_58 [16];
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  while ((uVar4 = (ulong)(byte)*flags, uVar4 < 0x2d &&
         ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0))) {
    flags = (char *)((byte *)flags + 1);
  }
  local_58 = (undefined1  [16])0x0;
  pbVar6 = (byte *)0x0;
  do {
    __s1 = (byte *)flags;
    if ((char)uVar4 == '\0') {
      entry->ae_fflags_set = local_58._0_8_;
      entry->ae_fflags_clear = local_58._8_8_;
      return (char *)pbVar6;
    }
    __n = 0;
    while ((0x2c < (byte)uVar4 || ((0x100100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
      lVar2 = __n + 1;
      __n = __n + 1;
      uVar4 = (ulong)__s1[lVar2];
    }
    flags = (char *)(__s1 + __n);
    for (puVar7 = &::flags[0].set; __s = ((flag *)(puVar7 + -2))->name, __s != (char *)0x0;
        puVar7 = puVar7 + 4) {
      sVar5 = strlen(__s);
      if ((sVar5 == __n) && (iVar3 = bcmp(__s1,__s,__n), iVar3 == 0)) {
        auVar1 = *(undefined1 (*) [16])puVar7;
        auVar8._0_8_ = auVar1._8_8_;
        auVar8._8_4_ = auVar1._0_4_;
        auVar8._12_4_ = auVar1._4_4_;
LAB_00127498:
        local_58 = local_58 | auVar8;
        break;
      }
      if ((sVar5 - 2 == __n) && (iVar3 = bcmp(__s1,__s + 2,__n), iVar3 == 0)) {
        auVar8 = *(undefined1 (*) [16])puVar7;
        goto LAB_00127498;
      }
    }
    while ((uVar4 = (ulong)(byte)*flags, uVar4 < 0x2d &&
           ((0x100100000200U >> (uVar4 & 0x3f) & 1) != 0))) {
      flags = (char *)((byte *)flags + 1);
    }
    if (__s == (char *)0x0 && pbVar6 == (byte *)0x0) {
      pbVar6 = __s1;
    }
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}